

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<bool> *bVal)

{
  ChNameValue<bool> local_30;
  ChNameValue<bool> *local_18;
  ChNameValue<bool> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<bool> *)this;
  ChNameValue<bool>::ChNameValue(&local_30,bVal);
  (*(this->super_ChArchive)._vptr_ChArchive[2])(this,&local_30);
  ChNameValue<bool>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }